

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_commit.cxx
# Opt level: O3

void __thiscall
nuraft::raft_server::on_snapshot_completed
          (raft_server *this,ptr<snapshot> *s,bool result,ptr<std::exception> *err)

{
  element_type *peVar1;
  element_type *peVar2;
  element_type *peVar3;
  int iVar4;
  undefined8 uVar5;
  long lVar6;
  ptr<snapshot> new_snp;
  ptr<raft_params> params;
  unique_lock<std::recursive_mutex> guard;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  ptr<snapshot> local_48;
  undefined1 local_38 [32];
  
  if ((err->super___shared_ptr<std::exception,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
      (element_type *)0x0) {
    if (result) {
      local_38._16_8_ = &this->lock_;
      local_38[0x18] = false;
      std::unique_lock<std::recursive_mutex>::lock
                ((unique_lock<std::recursive_mutex> *)(local_38 + 0x10));
      local_38[0x18] = true;
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar1 != (element_type *)0x0) {
        iVar4 = (*peVar1->_vptr_logger[7])();
        if (3 < iVar4) {
          peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          peVar2 = (s->super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          msg_if_given_abi_cxx11_
                    ((string *)local_68,
                     "snapshot idx %lu log_term %lu created, compact the log store if needed",
                     peVar2->last_log_idx_,peVar2->last_log_term_);
          (*peVar1->_vptr_logger[8])
                    (peVar1,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                     ,"on_snapshot_completed",0x265,local_68);
          if ((undefined1 *)local_68._0_8_ != local_58) {
            operator_delete((void *)local_68._0_8_);
          }
        }
      }
      (*((this->state_machine_).
         super___shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        _vptr_state_machine[0x10])(&local_48);
      set_last_snapshot(this,&local_48);
      context::get_params((context *)local_38);
      lVar6 = (local_48.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              last_log_idx_ -
              (long)*(int *)&((element_type *)(local_38._0_8_ + 0x28))->_vptr_state_mgr;
      if ((ulong)(long)*(int *)&((element_type *)(local_38._0_8_ + 0x28))->_vptr_state_mgr <=
          (local_48.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          last_log_idx_ && lVar6 != 0) {
        peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (peVar1 != (element_type *)0x0) {
          iVar4 = (*peVar1->_vptr_logger[7])();
          if (3 < iVar4) {
            peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            msg_if_given_abi_cxx11_((string *)local_68,"log_store_ compact upto %lu",lVar6);
            (*peVar1->_vptr_logger[8])
                      (peVar1,4,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                       ,"on_snapshot_completed",0x26e,local_68);
            if ((undefined1 *)local_68._0_8_ != local_58) {
              operator_delete((void *)local_68._0_8_);
            }
          }
        }
        local_68._8_8_ = 0;
        local_68._0_8_ = operator_new(0x20);
        *(code **)local_68._0_8_ = on_log_compacted;
        *(char *)(local_68._0_8_ + 8) = '\0';
        *(char *)(local_68._0_8_ + 9) = '\0';
        *(char *)(local_68._0_8_ + 10) = '\0';
        *(char *)(local_68._0_8_ + 0xb) = '\0';
        *(char *)(local_68._0_8_ + 0xc) = '\0';
        *(char *)(local_68._0_8_ + 0xd) = '\0';
        *(char *)(local_68._0_8_ + 0xe) = '\0';
        *(char *)(local_68._0_8_ + 0xf) = '\0';
        *(long *)(local_68._0_8_ + 0x10) = lVar6;
        *(raft_server **)(local_68._0_8_ + 0x18) = this;
        local_58._8_8_ =
             std::
             _Function_handler<void_(bool_&,_std::shared_ptr<std::exception>_&),_std::_Bind<void_(nuraft::raft_server::*(nuraft::raft_server_*,_unsigned_long,_std::_Placeholder<1>,_std::_Placeholder<2>))(unsigned_long,_bool,_std::shared_ptr<std::exception>_&)>_>
             ::_M_invoke;
        local_58._0_8_ =
             std::
             _Function_handler<void_(bool_&,_std::shared_ptr<std::exception>_&),_std::_Bind<void_(nuraft::raft_server::*(nuraft::raft_server_*,_unsigned_long,_std::_Placeholder<1>,_std::_Placeholder<2>))(unsigned_long,_bool,_std::shared_ptr<std::exception>_&)>_>
             ::_M_manager;
        peVar3 = (this->log_store_).
                 super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        (*peVar3->_vptr_log_store[0xf])(peVar3,lVar6);
        if ((code *)local_58._0_8_ != (code *)0x0) {
          (*(code *)local_58._0_8_)(local_68,local_68,3);
        }
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._8_8_);
      }
      if (local_48.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_48.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      std::unique_lock<std::recursive_mutex>::~unique_lock
                ((unique_lock<std::recursive_mutex> *)(local_38 + 0x10));
      goto LAB_001ceb89;
    }
    peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar1 == (element_type *)0x0) goto LAB_001ceb89;
    iVar4 = (*peVar1->_vptr_logger[7])();
    if (iVar4 < 4) goto LAB_001ceb89;
    peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    msg_if_given_abi_cxx11_((string *)local_68,"the state machine rejects to create the snapshot");
    (*peVar1->_vptr_logger[8])
              (peVar1,4,
               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
               ,"on_snapshot_completed",0x25d,local_68);
  }
  else {
    peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar1 == (element_type *)0x0) goto LAB_001ceb89;
    iVar4 = (*peVar1->_vptr_logger[7])();
    if (iVar4 < 2) goto LAB_001ceb89;
    peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    uVar5 = (**(code **)(*(long *)(err->
                                  super___shared_ptr<std::exception,_(__gnu_cxx::_Lock_policy)2>).
                                  _M_ptr + 0x10))();
    msg_if_given_abi_cxx11_((string *)local_68,"failed to create a snapshot due to %s",uVar5);
    (*peVar1->_vptr_logger[8])
              (peVar1,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
               ,"on_snapshot_completed",600,local_68);
  }
  if ((undefined1 *)local_68._0_8_ != local_58) {
    operator_delete((void *)local_68._0_8_);
  }
LAB_001ceb89:
  LOCK();
  (this->snp_in_progress_)._M_base._M_i = false;
  UNLOCK();
  return;
}

Assistant:

void raft_server::on_snapshot_completed
     ( ptr<snapshot>& s, bool result, ptr<std::exception>& err )
{
 do { // Dummy loop
    if (err != nilptr) {
        p_er( "failed to create a snapshot due to %s",
              err->what() );
        break;
    }

    if (!result) {
        p_in("the state machine rejects to create the snapshot");
        break;
    }

    {
        recur_lock(lock_);
        p_in("snapshot idx %" PRIu64 " log_term %" PRIu64 " created, "
             "compact the log store if needed",
             s->get_last_log_idx(), s->get_last_log_term());

        ptr<snapshot> new_snp = state_machine_->last_snapshot();
        set_last_snapshot(new_snp);
        ptr<raft_params> params = ctx_->get_params();
        if ( new_snp->get_last_log_idx() >
                 (ulong)params->reserved_log_items_ ) {
            ulong compact_upto = new_snp->get_last_log_idx() -
                                     (ulong)params->reserved_log_items_;
            p_in("log_store_ compact upto %" PRIu64 "", compact_upto);

            cmd_result<bool>::handler_type handler =
                (cmd_result<bool>::handler_type)
                std::bind( &raft_server::on_log_compacted,
                           this,
                           compact_upto,
                           std::placeholders::_1,
                           std::placeholders::_2 );

            log_store_->compact_async(compact_upto, handler);
        }
    }
 } while (false);

    snp_in_progress_.store(false);
}